

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool MultiplicationHelper<long,_int,_12>::Multiply(long *t,int u,long *ret)

{
  bool bVar1;
  int64_t tmp;
  int64_t t1;
  int64_t local_20;
  long local_18;
  
  local_18 = *t;
  local_20 = 0;
  bVar1 = LargeIntRegMultiply<long,_int>::RegMultiply(&local_18,u,&local_20);
  *ret = local_20;
  return bVar1;
}

Assistant:

static bool Multiply( const T& t, U u, T& ret ) SAFEINT_NOTHROW
    {
        static_assert(safeint_internal::int_traits<T>::isInt64, "T must be Int64");
        std::int64_t t1 = t;
        std::int64_t tmp = 0;
        bool f = LargeIntRegMultiply< std::int64_t, std::int32_t >::RegMultiply( t1, (std::int32_t)u, &tmp);
        ret = tmp;
        return f;
    }